

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-util.cpp
# Opt level: O1

void usage(FILE *stream)

{
  fprintf((FILE *)stream,
          "USAGE: %s [-h|-help] [-V]\n\n       %s -d <input-file>\n\n       %s -g | -u\n",
          "asdcp-util","asdcp-util","asdcp-util");
  fwrite("Major modes:\n  -d                - Calculate message digest of input file\n  -g                - Generate a random 16 byte value to stdout\n  -h | -help        - Show help\n  -u                - Generate a random UUID value to stdout\n  -V                - Show version information\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
         ,0x1b9,1,(FILE *)stream);
  return;
}

Assistant:

void
usage(FILE* stream = stdout)
{
  fprintf(stream, "\
USAGE: %s [-h|-help] [-V]\n\
\n\
       %s -d <input-file>\n\
\n\
       %s -g | -u\n",
	  PROGRAM_NAME, PROGRAM_NAME, PROGRAM_NAME);

  fprintf(stream, "\
Major modes:\n\
  -d                - Calculate message digest of input file\n\
  -g                - Generate a random 16 byte value to stdout\n\
  -h | -help        - Show help\n\
  -u                - Generate a random UUID value to stdout\n\
  -V                - Show version information\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\n");
}